

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<2,_10,_3>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 *puVar1;
  int row_2;
  long lVar2;
  undefined4 *puVar3;
  long lVar4;
  long lVar5;
  float v;
  float fVar6;
  undefined4 uVar7;
  undefined8 local_88;
  Type in1;
  Vector<float,_4> res;
  float local_5c [3];
  int local_50 [6];
  undefined8 uStack_38;
  Type in0;
  
  puVar1 = &uStack_38;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar2 = 0;
    lVar4 = 0;
    do {
      lVar5 = 0;
      do {
        uVar7 = 0x3f800000;
        if (lVar2 != lVar5) {
          uVar7 = 0;
        }
        *(undefined4 *)((long)puVar1 + lVar5) = uVar7;
        lVar5 = lVar5 + 0x10;
      } while (lVar5 != 0x30);
      lVar4 = lVar4 + 1;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      lVar2 = lVar2 + 0x10;
    } while (lVar4 != 4);
    uStack_38 = *(undefined8 *)evalCtx->in[0].m_data;
    in0.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    in0.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)evalCtx->in[1].m_data;
    in0.m_data.m_data[1].m_data._0_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    in0.m_data.m_data[1].m_data._8_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    in0.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)(evalCtx->in[2].m_data + 2);
  }
  else {
    in0.m_data.m_data[1].m_data[2] = 0.0;
    in0.m_data.m_data[1].m_data[3] = 0.0;
    in0.m_data.m_data[2].m_data[0] = 0.0;
    in0.m_data.m_data[2].m_data[1] = 0.0;
    in0.m_data.m_data[0].m_data[2] = 0.0;
    in0.m_data.m_data[0].m_data[3] = 0.0;
    in0.m_data.m_data[1].m_data[0] = 0.0;
    in0.m_data.m_data[1].m_data[1] = 0.0;
    uStack_38 = 0;
    in0.m_data.m_data[0].m_data[0] = 0.0;
    in0.m_data.m_data[0].m_data[1] = 0.0;
    puVar3 = &s_constInMat3x4;
    lVar2 = 0;
    do {
      lVar4 = 0;
      do {
        *(undefined4 *)((long)puVar1 + lVar4 * 4) = *(undefined4 *)((long)puVar3 + lVar4);
        lVar4 = lVar4 + 4;
      } while (lVar4 != 0xc);
      lVar2 = lVar2 + 1;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      puVar3 = puVar3 + 3;
    } while (lVar2 != 4);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    local_88 = *(undefined8 *)(evalCtx->coords).m_data;
    in1.m_data[0] = (evalCtx->coords).m_data[2];
  }
  else {
    local_88 = 0x3f000000be4ccccd;
    in1.m_data[0] = 0.8;
  }
  puVar1 = &uStack_38;
  lVar2 = 0;
  do {
    fVar6 = 0.0;
    lVar4 = 0;
    do {
      fVar6 = fVar6 + *(float *)((long)puVar1 + lVar4 * 4) *
                      *(float *)((long)in1.m_data + lVar4 + -8);
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0xc);
    in1.m_data[lVar2 + 2] = fVar6;
    lVar2 = lVar2 + 1;
    puVar1 = (undefined8 *)((long)puVar1 + 4);
  } while (lVar2 != 4);
  local_50[2] = 0;
  local_50[3] = 1;
  local_50[4] = 2;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[local_50[lVar2]] = res.m_data[lVar2 + 3];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}